

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LZ77_test.cpp
# Opt level: O0

void __thiscall DecryptLz77::test_method(DecryptLz77 *this)

{
  undefined8 uVar1;
  bool bVar2;
  pointer pCVar3;
  lazy_ostream *plVar4;
  basic_cstring<const_char> local_190;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_180;
  basic_cstring<const_char> local_158;
  basic_cstring<const_char> local_148;
  undefined1 local_138 [8];
  string out_msg;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_108;
  basic_cstring<const_char> local_e0;
  basic_cstring<const_char> local_d0;
  undefined1 local_c0 [8];
  string in_msg;
  string local_98;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  undefined1 local_18 [8];
  unique_ptr<Cryptor,_std::default_delete<Cryptor>_> cryptor;
  DecryptLz77 *this_local;
  
  cryptor._M_t.super___uniq_ptr_impl<Cryptor,_std::default_delete<Cryptor>_>._M_t.
  super__Tuple_impl<0UL,_Cryptor_*,_std::default_delete<Cryptor>_>.
  super__Head_base<0UL,_Cryptor_*,_false>._M_head_impl =
       (__uniq_ptr_data<Cryptor,_std::default_delete<Cryptor>,_true,_true>)
       (__uniq_ptr_data<Cryptor,_std::default_delete<Cryptor>,_true,_true>)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"-d",&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"Lz77",&local_71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"AAAAABBAAACCCC[13,4]A[11,6]BBBBBBBDD[33,6]BBB",
             (allocator<char> *)(in_msg.field_2._M_local_buf + 0xf));
  Cryptor::cryptor_factory((Cryptor *)local_18,&local_38,&local_70,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator((allocator<char> *)(in_msg.field_2._M_local_buf + 0xf));
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  pCVar3 = std::unique_ptr<Cryptor,_std::default_delete<Cryptor>_>::operator->
                     ((unique_ptr<Cryptor,_std::default_delete<Cryptor>_> *)local_18);
  Cryptor::get_in_message_abi_cxx11_((string *)local_c0,pCVar3);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_d0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dabudabot[P]CifeProject/test/LZ77_test.cpp"
               ,0x61);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_e0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_d0,0x23,&local_e0);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_108,plVar4,(char (*) [1])0x116590);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)((long)&out_msg.field_2 + 8),
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dabudabot[P]CifeProject/test/LZ77_test.cpp"
               ,0x61);
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[46]>
              (&local_108,(undefined1 *)((long)&out_msg.field_2 + 8),0x23,1,2,local_c0,"in_msg",
               "AAAAABBAAACCCC[13,4]A[11,6]BBBBBBBDD[33,6]BBB",
               "\"AAAAABBAAACCCC[13,4]A[11,6]BBBBBBBDD[33,6]BBB\"");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_108);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  pCVar3 = std::unique_ptr<Cryptor,_std::default_delete<Cryptor>_>::operator->
                     ((unique_ptr<Cryptor,_std::default_delete<Cryptor>_> *)local_18);
  (*pCVar3->_vptr_Cryptor[2])();
  pCVar3 = std::unique_ptr<Cryptor,_std::default_delete<Cryptor>_>::operator->
                     ((unique_ptr<Cryptor,_std::default_delete<Cryptor>_> *)local_18);
  Cryptor::get_out_message_abi_cxx11_((string *)local_138,pCVar3);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_148,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dabudabot[P]CifeProject/test/LZ77_test.cpp"
               ,0x61);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_158);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_148,0x29,&local_158);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_180,plVar4,(char (*) [1])0x116590);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_190,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dabudabot[P]CifeProject/test/LZ77_test.cpp"
               ,0x61);
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[44]>
              (&local_180,&local_190,0x29,1,2,local_138,"out_msg",
               "AAAAABBAAACCCCAAAAAAACCCCBBBBBBBDDAAAABBBBB",
               "\"AAAAABBAAACCCCAAAAAAACCCCBBBBBBBDDAAAABBBBB\"");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_180);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::__cxx11::string::~string((string *)local_138);
  std::__cxx11::string::~string((string *)local_c0);
  std::unique_ptr<Cryptor,_std::default_delete<Cryptor>_>::~unique_ptr
            ((unique_ptr<Cryptor,_std::default_delete<Cryptor>_> *)local_18);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(DecryptLz77) {

  auto cryptor = Cryptor::cryptor_factory(
    "-d",
    "Lz77",
    "AAAAABBAAACCCC[13,4]A[11,6]BBBBBBBDD[33,6]BBB"
  );

  const auto in_msg = cryptor->get_in_message();

  BOOST_CHECK_EQUAL(in_msg, "AAAAABBAAACCCC[13,4]A[11,6]BBBBBBBDD[33,6]BBB");

  cryptor->run();

  const auto out_msg = cryptor->get_out_message();

  BOOST_CHECK_EQUAL(out_msg, "AAAAABBAAACCCCAAAAAAACCCCBBBBBBBDDAAAABBBBB");
}